

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImGuiTable::~ImGuiTable(ImGuiTable *this)

{
  int *piVar1;
  void *pvVar2;
  ImGuiTableColumnSortSpecs *pIVar3;
  ImGuiTableInstanceData *pIVar4;
  char *pcVar5;
  
  pvVar2 = this->RawData;
  if ((pvVar2 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + -1;
  }
  (*GImAllocatorFreeFunc)(pvVar2,GImAllocatorUserData);
  pIVar3 = (this->SortSpecsMulti).Data;
  if (pIVar3 != (ImGuiTableColumnSortSpecs *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
  }
  pIVar4 = (this->InstanceDataExtra).Data;
  if (pIVar4 != (ImGuiTableInstanceData *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
  }
  pcVar5 = (this->ColumnsNames).Buf.Data;
  if (pcVar5 != (char *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar5,GImAllocatorUserData);
  }
  return;
}

Assistant:

~ImGuiTable()               { IM_FREE(RawData); }